

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::PixelUnpackBufferStorageTestCase::execute
          (PixelUnpackBufferStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  GLenum GVar1;
  int iVar2;
  TestError *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  byte local_1fb;
  byte local_1fa;
  byte local_1f9;
  MessageBuilder local_1e0;
  bool local_5e;
  uchar local_5d;
  uint local_5c;
  bool is_from_committed_page;
  uint uStack_58;
  char expected_value;
  uint n_component;
  uint x;
  uint y;
  char *texture_data_traveller_ptr;
  char *read_data_traveller_ptr;
  uint n_current_tex_data_byte;
  byte local_29;
  uint local_28;
  uint uStack_24;
  bool should_commit;
  uint n_page;
  uint n_pages;
  bool result_local;
  uint n_iteration;
  bool result;
  PixelUnpackBufferStorageTestCase *pPStack_10;
  GLuint sparse_bo_storage_flags_local;
  PixelUnpackBufferStorageTestCase *this_local;
  
  result_local = true;
  n_iteration = sparse_bo_storage_flags;
  pPStack_10 = this;
  (*this->m_gl->bindBuffer)(0x88ec,this->m_sparse_bo);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xd93);
  (*this->m_gl->bindTexture)(0xde1,this->m_to);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xd96);
  (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xd99);
  n_pages = 0;
  do {
    if (2 < n_pages) {
      return (bool)(result_local & 1);
    }
    n_page._3_1_ = 1;
    if (n_pages == 0) {
      (*this->m_gl->bufferPageCommitmentARB)(0x88ec,0,(ulong)this->m_sparse_bo_size_rounded,'\x01');
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0xdac);
      (*this->m_gl->copyBufferSubData)(0x8f36,0x88ec,0,0,(ulong)this->m_texture_data_size);
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glCopyBufferSubData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0xdb1);
    }
    else if (n_pages == 1) {
      uStack_24 = this->m_texture_data_size / (uint)this->m_page_size;
      for (local_28 = 0; local_28 < uStack_24; local_28 = local_28 + 1) {
        local_29 = (local_28 & 1) == 0;
        (*this->m_gl->bufferPageCommitmentARB)
                  (0x88ec,(ulong)(this->m_page_size * local_28),(long)this->m_page_size,local_29);
        GVar1 = (*this->m_gl->getError)();
        glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0xdc0);
        if ((local_29 & 1) != 0) {
          (*this->m_gl->copyBufferSubData)
                    (0x8f36,0x88ec,(ulong)(this->m_page_size * local_28),
                     (ulong)(this->m_page_size * local_28),(long)this->m_page_size);
          GVar1 = (*this->m_gl->getError)();
          glu::checkError(GVar1,"glCopyBufferSubData() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                          ,0xdc8);
        }
      }
    }
    else if (n_pages != 2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid iteration index",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                 ,0xdd7);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*this->m_gl->texSubImage2D)
              (0xde1,0,0,0,this->m_to_width,this->m_to_height,0x1908,0x1401,this->m_to_data_zero);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glTexSubImage2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xde2);
    (*this->m_gl->texSubImage2D)
              (0xde1,0,0,0,this->m_to_width,this->m_to_height,0x1908,0x1401,(void *)0x0);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glTexSubImage2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xde9);
    memset(this->m_read_data_ptr,0xff,(ulong)this->m_texture_data_size);
    (*this->m_gl->getTexImage)(0xde1,0,0x1908,0x1401,this->m_read_data_ptr);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glGetTexImage() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xdf0);
    read_data_traveller_ptr._0_4_ = 0;
    texture_data_traveller_ptr = (char *)this->m_read_data_ptr;
    _x = this->m_texture_data_ptr;
    n_component = 0;
    while( true ) {
      local_1f9 = 0;
      if (n_component < this->m_to_height) {
        local_1f9 = n_page._3_1_;
      }
      if ((local_1f9 & 1) == 0) break;
      uStack_58 = 0;
      while( true ) {
        local_1fa = 0;
        if (uStack_58 < this->m_to_width) {
          local_1fa = n_page._3_1_;
        }
        if ((local_1fa & 1) == 0) break;
        local_5c = 0;
        while( true ) {
          local_1fb = 0;
          if (local_5c < 4) {
            local_1fb = n_page._3_1_;
          }
          if ((local_1fb & 1) == 0) break;
          local_5d = '\0';
          if (n_pages == 1) {
            local_5e = ((ulong)(uint)read_data_traveller_ptr / (ulong)(uint)this->m_page_size & 1)
                       == 0;
          }
          else {
            local_5e = n_pages != 2;
          }
          if (local_5e == false) {
LAB_01178ad3:
            if (((local_5e & 1U) == 0) && (*texture_data_traveller_ptr != local_5d))
            goto LAB_01178af0;
          }
          else {
            local_5d = *_x;
            iVar2 = de::abs<int>((int)(char)local_5d - (int)*texture_data_traveller_ptr);
            if (iVar2 < 1) goto LAB_01178ad3;
LAB_01178af0:
            this_01 = tcu::TestContext::getLog(this->m_testCtx);
            tcu::TestLog::operator<<(&local_1e0,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar3 = tcu::MessageBuilder::operator<<
                               (&local_1e0,(char (*) [29])"Invalid texel data (channel:");
            pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_5c);
            pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [14])") found at X:");
            pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&stack0xffffffffffffffa8);
            pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])", Y:");
            pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&n_component);
            pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [19])"). Expected value:");
            pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char *)&local_5d);
            pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])", found value:");
            pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char *)_x);
            tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_1e0);
            n_page._3_1_ = 0;
          }
          read_data_traveller_ptr._0_4_ = (uint)read_data_traveller_ptr + 1;
          texture_data_traveller_ptr = texture_data_traveller_ptr + 1;
          _x = _x + 1;
          local_5c = local_5c + 1;
        }
        uStack_58 = uStack_58 + 1;
      }
      n_component = n_component + 1;
    }
    result_local = (result_local & 1U & n_page._3_1_ & 1) != 0;
    (*this->m_gl->bufferPageCommitmentARB)(0x88ec,0,(ulong)this->m_sparse_bo_size_rounded,'\0');
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xe2b);
    n_pages = n_pages + 1;
  } while( true );
}

Assistant:

bool PixelUnpackBufferStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	bool result = true;

	m_gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, m_sparse_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.bindTexture(GL_TEXTURE_2D, m_to);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindTexture() call failed.");

	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindTexture() call failed.");

	/* Run three separate iterations:
	 *
	 * a) All pages holding the source texture data are committed.
	 * b) Use a zig-zag memory page commitment layout patern.
	 * b) No pages are committed.
	 */
	for (unsigned int n_iteration = 0; n_iteration < 3; ++n_iteration)
	{
		bool result_local = true;

		/* Set up the memory page commitment & the storage contents*/
		switch (n_iteration)
		{
		case 0:
		{
			m_gl.bufferPageCommitmentARB(GL_PIXEL_UNPACK_BUFFER, 0,			 /* offset */
										 m_sparse_bo_size_rounded, GL_TRUE); /* commit */
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

			m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_PIXEL_UNPACK_BUFFER, 0, /* readOffset */
								   0,											   /* writeOffset */
								   m_texture_data_size);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

			break;
		}

		case 1:
		{
			const unsigned int n_pages = m_texture_data_size / m_page_size;

			for (unsigned int n_page = 0; n_page < n_pages; ++n_page)
			{
				const bool should_commit = ((n_page % 2) == 0);

				m_gl.bufferPageCommitmentARB(GL_PIXEL_UNPACK_BUFFER, m_page_size * n_page, m_page_size,
											 should_commit ? GL_TRUE : GL_FALSE);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

				if (should_commit)
				{
					m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_PIXEL_UNPACK_BUFFER,
										   m_page_size * n_page, /* readOffset */
										   m_page_size * n_page, /* writeOffset */
										   m_page_size);
					GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");
				}
			} /* for (all relevant memory pages) */

			break;
		}

		case 2:
		{
			/* Do nothing */
			break;
		}

		default:
		{
			TCU_FAIL("Invalid iteration index");
		}
		} /* switch (n_iteration) */

		/* Clean up the base mip-map's contents before we proceeding with updating it
		 * with data downloaded from the BO, in order to avoid situation where silently
		 * failing glTexSubImage2D() calls slip past unnoticed */
		m_gl.texSubImage2D(GL_TEXTURE_2D, 0, /* level */
						   0,				 /* xoffset */
						   0,				 /* yoffset */
						   m_to_width, m_to_height, GL_RGBA, GL_UNSIGNED_BYTE, m_to_data_zero);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glTexSubImage2D() call failed.");

		/* Update the base mip-map's contents */
		m_gl.texSubImage2D(GL_TEXTURE_2D, 0, /* level */
						   0,				 /* xoffset */
						   0,				 /* yoffset */
						   m_to_width, m_to_height, GL_RGBA, GL_UNSIGNED_BYTE, (const glw::GLvoid*)0);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glTexSubImage2D() call failed.");

		/* Read back the stored mip-map data */
		memset(m_read_data_ptr, 0xFF, m_texture_data_size);

		m_gl.getTexImage(GL_TEXTURE_2D, 0, /* level */
						 GL_RGBA, GL_UNSIGNED_BYTE, m_read_data_ptr);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetTexImage() call failed.");

		/* Verify the data */
		unsigned int n_current_tex_data_byte	= 0;
		const char*  read_data_traveller_ptr	= (const char*)m_read_data_ptr;
		const char*  texture_data_traveller_ptr = (const char*)m_texture_data_ptr;

		for (unsigned int y = 0; y < m_to_height && result_local; ++y)
		{
			for (unsigned int x = 0; x < m_to_width && result_local; ++x)
			{
				for (unsigned int n_component = 0; n_component < 4 /* rgba */ && result_local; ++n_component)
				{
					char expected_value			= 0;
					bool is_from_committed_page = true;

					if (n_iteration == 1) /* zig-zag */
					{
						is_from_committed_page = ((n_current_tex_data_byte / m_page_size) % 2) == 0;
					}
					else if (n_iteration == 2) /* no pages committed */
					{
						is_from_committed_page = false;
					}

					if (is_from_committed_page)
					{
						expected_value = *texture_data_traveller_ptr;
					}

					if ((is_from_committed_page && de::abs(expected_value - *read_data_traveller_ptr) >= 1) ||
						(!is_from_committed_page && *read_data_traveller_ptr != expected_value))
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid texel data (channel:" << n_component
										   << ")"
											  " found at X:"
										   << x << ", "
												   "Y:"
										   << y << ")."
												   " Expected value:"
										   << expected_value << ","
																" found value:"
										   << *texture_data_traveller_ptr << tcu::TestLog::EndMessage;

						result_local = false;
					}

					n_current_tex_data_byte++;
					read_data_traveller_ptr++;
					texture_data_traveller_ptr++;
				} /* for (all components) */
			}	 /* for (all columns) */
		}		  /* for (all rows) */

		result &= result_local;

		/* Clean up */
		m_gl.bufferPageCommitmentARB(GL_PIXEL_UNPACK_BUFFER, 0,			  /* offset */
									 m_sparse_bo_size_rounded, GL_FALSE); /* commit */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
	} /* for (three iterations) */

	return result;
}